

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O0

Vector3f __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::GetPositionForEntryId
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,int entry_id)

{
  VectorD<float,_3> *in_RSI;
  GeometryAttribute *in_RDI;
  undefined8 extraout_XMM0_Qa;
  float in_XMM1_Da;
  Vector3f VVar1;
  PointIndex point_id;
  Vector3f *pos;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  AttributeValueIndex att_index;
  
  VectorD<float,_3>::VectorD(in_RSI);
  att_index.value_ = (uint)((ulong)*(undefined8 *)in_RSI[8].v_._M_elems >> 0x20);
  PointAttribute::mapped_index
            ((PointAttribute *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (PointIndex)(uint)in_RSI);
  VectorD<float,_3>::operator[](in_RSI,in_stack_ffffffffffffffbc);
  GeometryAttribute::ConvertValue<float>(in_RDI,att_index,(float *)in_RSI);
  VVar1.v_._M_elems[2] = in_XMM1_Da;
  VVar1.v_._M_elems[0] = (float)(int)extraout_XMM0_Qa;
  VVar1.v_._M_elems[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vector3f)VVar1.v_._M_elems;
}

Assistant:

Vector3f GetPositionForEntryId(int entry_id) const {
    const PointIndex point_id = entry_to_point_id_map_[entry_id];
    Vector3f pos;
    pos_attribute_->ConvertValue(pos_attribute_->mapped_index(point_id),
                                 &pos[0]);
    return pos;
  }